

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testBind(LifeTest *this)

{
  uint uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Name name;
  ResultCollector errors;
  Name local_40;
  ResultCollector local_30;
  
  local_30.m_testCtx = (this->super_TestBase).super_TestCase.super_TestNode.m_testCtx;
  local_30.m_log = (local_30.m_testCtx)->m_log;
  local_30.m_result = QP_TEST_RESULT_PASS;
  local_30.m_message = "Pass";
  local_40.m_type = this->m_type;
  uVar1 = (*(local_40.m_type)->_vptr_Type[2])();
  local_40.m_name = uVar1;
  iVar2 = (*this->m_type->_vptr_Type[6])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar2),uVar1);
  iVar2 = (*((this->super_TestBase).m_ctx.m_renderCtx)->_vptr_RenderContext[3])();
  err = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
  glu::checkError(err,"Bind failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x30a);
  iVar2 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)local_40.m_name);
  if ((char)iVar2 == '\0') {
    ResultCollector::fail(&local_30,"Object does not exist after binding");
  }
  iVar2 = (*this->m_type->_vptr_Type[6])();
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var_01,iVar2),0);
  Name::~Name(&local_40);
  ResultCollector::~ResultCollector(&local_30);
  return;
}

Assistant:

void LifeTest::testBind (void)
{
	ResultCollector	errors	(getTestContext());
	Name			name	(m_type);

	binder().bind(*name);
	GLU_EXPECT_NO_ERROR(gl().getError(), "Bind failed");
	errors.check(m_type.exists(*name), "Object does not exist after binding");
	binder().bind(0);
}